

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O2

Operator __thiscall
calculator::ExpressionParser<__int128>::parseOp(ExpressionParser<__int128> *this)

{
  ulong uVar1;
  char cVar2;
  ulong uVar3;
  ulong uVar4;
  pointer pcVar5;
  size_t sVar6;
  int iVar7;
  ulong uVar8;
  Operator OVar9;
  ulong uStack_50;
  allocator<char> local_39;
  string local_38;
  
  eatSpaces(this);
  uVar3 = (this->expr_)._M_string_length;
  uVar4 = this->index_;
  iVar7 = 0x4c;
  if (uVar3 <= uVar4) {
switchD_001148d3_caseD_27:
    uVar8 = 0;
    uStack_50 = 0;
    goto LAB_00114a79;
  }
  pcVar5 = (this->expr_)._M_dataplus._M_p;
  cVar2 = pcVar5[uVar4];
  switch(cVar2) {
  case '%':
    uVar8 = 0x1400000000;
    this->index_ = uVar4 + 1;
    uStack_50 = 10;
    break;
  case '&':
    this->index_ = uVar4 + 1;
    uStack_50 = 3;
    uVar8 = 0x600000000;
    break;
  case '\'':
  case '(':
  case ')':
  case ',':
  case '.':
    goto switchD_001148d3_caseD_27;
  case '*':
    uVar8 = 0x1400000000;
    uVar1 = uVar4 + 1;
    this->index_ = uVar1;
    uStack_50 = 8;
    if ((uVar3 <= uVar1) || (pcVar5[uVar1] != '*')) break;
    sVar6 = uVar4 + 2;
LAB_00114a33:
    uVar8 = 0x1e00000000;
    this->index_ = sVar6;
    uStack_50 = 0xb;
    goto LAB_00114a39;
  case '+':
    uVar8 = 0xa00000000;
    this->index_ = uVar4 + 1;
    uStack_50 = 6;
    break;
  case '-':
    uVar8 = 0xa00000000;
    this->index_ = uVar4 + 1;
    uStack_50 = 7;
    break;
  case '/':
    uVar8 = 0x1400000000;
    this->index_ = uVar4 + 1;
    uStack_50 = 9;
    break;
  default:
    if (cVar2 == '<') {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"<<",&local_39);
      expect(this,&local_38);
      uVar8 = 0x900000000;
      std::__cxx11::string::~string((string *)&local_38);
      uStack_50 = 4;
      break;
    }
    if (cVar2 == '>') {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,">>",&local_39);
      expect(this,&local_38);
      uVar8 = 0x900000000;
      std::__cxx11::string::~string((string *)&local_38);
      uStack_50 = 5;
      break;
    }
    if (cVar2 != 'E') {
      if (cVar2 == '^') {
        sVar6 = uVar4 + 1;
        goto LAB_00114a33;
      }
      if (cVar2 != 'e') {
        if (cVar2 == '|') {
          this->index_ = uVar4 + 1;
          uStack_50 = 1;
          uVar8 = 0x400000000;
          break;
        }
        goto switchD_001148d3_caseD_27;
      }
    }
    uVar8 = 0x2800000000;
    this->index_ = uVar4 + 1;
    uStack_50 = 0xc;
LAB_00114a39:
    iVar7 = 0x52;
  }
LAB_00114a79:
  OVar9.associativity = iVar7;
  OVar9.op = (int)(uVar8 | uStack_50);
  OVar9.precedence = (int)((uVar8 | uStack_50) >> 0x20);
  return OVar9;
}

Assistant:

Operator parseOp()
  {
    eatSpaces();
    switch (getCharacter())
    {
      case '|': index_++;     return Operator(OPERATOR_BITWISE_OR,      4, 'L');
      case '&': index_++;     return Operator(OPERATOR_BITWISE_AND,     6, 'L');
      case '<': expect("<<"); return Operator(OPERATOR_BITWISE_SHL,     9, 'L');
      case '>': expect(">>"); return Operator(OPERATOR_BITWISE_SHR,     9, 'L');
      case '+': index_++;     return Operator(OPERATOR_ADDITION,       10, 'L');
      case '-': index_++;     return Operator(OPERATOR_SUBTRACTION,    10, 'L');
      case '/': index_++;     return Operator(OPERATOR_DIVISION,       20, 'L');
      case '%': index_++;     return Operator(OPERATOR_MODULO,         20, 'L');
      case '*': index_++; if (getCharacter() != '*')
                              return Operator(OPERATOR_MULTIPLICATION, 20, 'L');
                index_++;     return Operator(OPERATOR_POWER,          30, 'R');
      case '^': index_++;     return Operator(OPERATOR_POWER,          30, 'R');
      case 'e': index_++;     return Operator(OPERATOR_EXPONENT,       40, 'R');
      case 'E': index_++;     return Operator(OPERATOR_EXPONENT,       40, 'R');
      default :               return Operator(OPERATOR_NULL,            0, 'L');
    }
  }